

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_rightRotate
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  size_t sVar1;
  bool bVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *this_00;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_00;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  size_t local_48;
  size_t tmp_count;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *tmp_node;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *left;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  this_00 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::left(node);
  node_00 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::right(this_00);
  sVar1 = this_00->node_count;
  this_00->node_count = node->node_count;
  if (node_00 ==
      (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
       *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = node_00->node_count;
  }
  node->node_count = node->node_count - (sVar1 - local_48);
  if (node == this->_root) {
    this->_root = this_00;
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::initRoot(this->_root);
  }
  else {
    bVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::isLeft(node);
    if (bVar2) {
      pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::parent(node);
      bVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(node);
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertLeft(pRVar3,this_00,bVar2);
    }
    else {
      pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::parent(node);
      bVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(node);
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertRight(pRVar3,this_00,bVar2);
    }
  }
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>::
  insertRight(this_00,node,true);
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>::
  insertLeft(node,node_00,false);
  return this_00;
}

Assistant:

inline
    RBTreeNode<TreeElement<Key, Value>>* RBTree<Key, Value>::_rightRotate(RBTreeNode<TreeElement<Key, Value>> *node){
        auto left = node->left();
        auto tmp_node = left->right();

        // use the node's count to instead of left-child's and:
        // left-child's count = right-child's count + left-child's right-child's count
        auto tmp_count = left->node_count;
        left->node_count = node->node_count;
        node->node_count -= tmp_count - (tmp_node != nullptr ? tmp_node->node_count : 0);

        if (node == _root) {
            _root = left;
            _root->initRoot();
        } else if (node->isLeft()) {
            node->parent()->insertLeft(left, node->isRed());
        } else {
            node->parent()->insertRight(left, node->isRed());
        }
        left->insertRight(node, true);
        node->insertLeft(tmp_node);
        return left;
    }